

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void hta::throw_exception<hta::Exception,char_const*>(char *args)

{
  Exception *this;
  string local_1c0;
  stringstream msg;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  std::operator<<(local_190,args);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&local_1c0);
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}